

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined1 uVar1;
  bool bVar2;
  MapFieldBase *this;
  MapFieldBase *other;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  SwapFieldHelper local_30 [16];
  
  if (field->type_ == '\v') {
    bVar2 = FieldDescriptor::is_map_message_type(field);
    if (bVar2) {
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      this = (MapFieldBase *)Reflection::MutableRawImpl(r,lhs,field);
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      other = (MapFieldBase *)Reflection::MutableRawImpl(r,rhs,field);
      MapFieldBase::InternalSwap(this,other);
      return;
    }
  }
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  pvVar3 = Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  pvVar4 = Reflection::MutableRawImpl(r,rhs,field);
  if (pvVar3 != pvVar4) {
    lVar5 = 0;
    do {
      uVar1 = *(undefined1 *)((long)pvVar3 + lVar5);
      *(undefined1 *)((long)pvVar3 + lVar5) = *(undefined1 *)((long)pvVar4 + lVar5);
      *(undefined1 *)((long)pvVar4 + lVar5) = uVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    return;
  }
  SwapRepeatedMessageField<true>(local_30);
}

Assistant:

void SwapFieldHelper::SwapRepeatedMessageField(const Reflection* r,
                                               Message* lhs, Message* rhs,
                                               const FieldDescriptor* field) {
  if (IsMapFieldInApi(field)) {
    auto* lhs_map = r->MutableRaw<MapFieldBase>(lhs, field);
    auto* rhs_map = r->MutableRaw<MapFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_map->InternalSwap(rhs_map);
    } else {
      lhs_map->Swap(rhs_map);
    }
  } else {
    auto* lhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
    auto* rhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_rm->InternalSwap(rhs_rm);
    } else {
      lhs_rm->Swap<GenericTypeHandler<Message>>(rhs_rm);
    }
  }
}